

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

void unistrTextCopy(UText *ut,int64_t start,int64_t limit,int64_t destIndex,UBool move,
                   UErrorCode *pErrorCode)

{
  UnicodeString *this;
  UBool UVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  char16_t *pcVar5;
  int32_t segLength;
  int32_t destIndex32;
  int32_t limit32;
  int32_t start32;
  int32_t length;
  UnicodeString *us;
  UErrorCode *pErrorCode_local;
  int64_t iStack_28;
  UBool move_local;
  int64_t destIndex_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  this = (UnicodeString *)ut->context;
  iStack_28 = destIndex;
  destIndex_local = limit;
  limit_local = start;
  start_local = (int64_t)ut;
  iVar2 = icu_63::UnicodeString::length(this);
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    destIndex32 = pinIndex(&limit_local,(long)iVar2);
    uVar3 = pinIndex(&destIndex_local,(long)iVar2);
    uVar4 = pinIndex(&stack0xffffffffffffffd8,(long)iVar2);
    if (((int)uVar3 < destIndex32) || ((destIndex32 < (int)uVar4 && ((int)uVar4 < (int)uVar3)))) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      if (move == '\0') {
        (*(this->super_Replaceable).super_UObject._vptr_UObject[5])
                  (this,(ulong)(uint)destIndex32,(ulong)uVar3,(ulong)uVar4);
      }
      else {
        (*(this->super_Replaceable).super_UObject._vptr_UObject[5])
                  (this,(ulong)(uint)destIndex32,(ulong)uVar3,(ulong)uVar4);
        if ((int)uVar4 < destIndex32) {
          destIndex32 = (uVar3 - destIndex32) + destIndex32;
        }
        icu_63::UnicodeString::remove(this,(char *)(ulong)(uint)destIndex32);
      }
      pcVar5 = icu_63::UnicodeString::getBuffer(this);
      *(char16_t **)(start_local + 0x30) = pcVar5;
      if (move == '\0') {
        *(uint *)(start_local + 0x2c) = (uVar3 - destIndex32) + *(int *)(start_local + 0x2c);
        *(long *)(start_local + 0x10) = (long)*(int *)(start_local + 0x2c);
        *(undefined4 *)(start_local + 0x1c) = *(undefined4 *)(start_local + 0x2c);
      }
      *(uint *)(start_local + 0x28) = (uVar4 + uVar3) - destIndex32;
      if ((move != '\0') && (destIndex32 < (int)uVar4)) {
        *(uint *)(start_local + 0x28) = uVar4;
      }
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
unistrTextCopy(UText *ut,
               int64_t start, int64_t limit,
               int64_t destIndex,
               UBool move,
               UErrorCode *pErrorCode) {
    UnicodeString *us=(UnicodeString *)ut->context;
    int32_t length=us->length();

    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    int32_t start32 = pinIndex(start, length);
    int32_t limit32 = pinIndex(limit, length);
    int32_t destIndex32 = pinIndex(destIndex, length);

    if( start32>limit32 || (start32<destIndex32 && destIndex32<limit32)) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return;
    }

    if(move) {
        // move: copy to destIndex, then remove original
        int32_t segLength=limit32-start32;
        us->copy(start32, limit32, destIndex32);
        if(destIndex32<start32) {
            start32+=segLength;
        }
        us->remove(start32, segLength);
    } else {
        // copy
        us->copy(start32, limit32, destIndex32);
    }

    // update chunk description, set iteration position.
    ut->chunkContents = us->getBuffer();
    if (move==FALSE) {
        // copy operation, string length grows
        ut->chunkLength += limit32-start32;
        ut->chunkNativeLimit = ut->chunkLength;
        ut->nativeIndexingLimit = ut->chunkLength;
    }

    // Iteration position to end of the newly inserted text.
    ut->chunkOffset = destIndex32+limit32-start32;
    if (move && destIndex32>start32) {
        ut->chunkOffset = destIndex32;
    }

}